

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_QPDFTokenizer.cc
# Opt level: O3

void __thiscall Pl_QPDFTokenizer::~Pl_QPDFTokenizer(Pl_QPDFTokenizer *this)

{
  Members *pMVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_QPDFTokenizer_002ea6d0;
  pMVar1 = (this->m)._M_t.
           super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
           ._M_t.
           super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
           .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl;
  if (pMVar1 != (Members *)0x0) {
    Pl_Buffer::~Pl_Buffer(&pMVar1->buf);
    QPDFTokenizer::~QPDFTokenizer(&pMVar1->tokenizer);
    operator_delete(pMVar1,0x48);
  }
  (this->m)._M_t.
  super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>.
  _M_t.
  super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
  .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl = (Members *)0x0;
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pipeline_002e9b60;
  pcVar2 = (this->super_Pipeline).identifier._M_dataplus._M_p;
  paVar3 = &(this->super_Pipeline).identifier.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Pl_QPDFTokenizer::~Pl_QPDFTokenizer() = default;